

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingScanPartial<unsigned_char,signed_char,unsigned_char>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  data_ptr_t data;
  BitpackingMode BVar1;
  byte bVar2;
  uchar uVar3;
  data_ptr_t pdVar4;
  BitpackingScanState<unsigned_char,_signed_char> *this;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  idx_t iVar10;
  uint8_t *in;
  ulong __n;
  
  this = (BitpackingScanState<unsigned_char,_signed_char> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    iVar10 = this->current_group_offset;
    uVar8 = 0;
    do {
      if (iVar10 == 0x800) {
        BitpackingScanState<unsigned_char,_signed_char>::LoadNextGroup(this);
        iVar10 = this->current_group_offset;
      }
      BVar1 = (this->current_group).mode;
      sVar5 = scan_count - uVar8;
      if (BVar1 == CONSTANT_DELTA) {
        __n = 0x800 - iVar10;
        if (sVar5 < 0x800 - iVar10) {
          __n = sVar5;
        }
        if (__n != 0) {
          sVar5 = 0;
          do {
            pdVar4[sVar5 + uVar8 + result_offset] =
                 this->current_constant * ((char)(int)this->current_group_offset + (char)sVar5) +
                 this->current_frame_of_reference;
            sVar5 = sVar5 + 1;
          } while (__n != sVar5);
          goto LAB_01074916;
        }
LAB_0107491d:
        iVar10 = iVar10 + __n;
      }
      else {
        if (BVar1 == CONSTANT) {
          __n = 0x800 - iVar10;
          if (sVar5 < 0x800 - iVar10) {
            __n = sVar5;
          }
          switchD_01043a80::default
                    (pdVar4 + uVar8 + result_offset,(uint)this->current_constant,sVar5);
LAB_01074916:
          iVar10 = this->current_group_offset;
          goto LAB_0107491d;
        }
        uVar9 = (uint)iVar10 & 0x1f;
        __n = 0x20 - (ulong)uVar9;
        if (sVar5 < __n) {
          __n = sVar5;
        }
        bVar2 = this->current_width;
        uVar7 = (ulong)bVar2;
        in = this->current_group_ptr + ((iVar10 * uVar7 >> 3) - (ulong)(uVar9 * bVar2 >> 3));
        data = pdVar4 + uVar8 + result_offset;
        if (__n == 0x20) {
          lVar6 = 0;
          do {
            duckdb_fastpforlib::internal::fastunpack_quarter(in,data + lVar6,(uint)bVar2);
            lVar6 = lVar6 + 8;
            in = in + uVar7;
          } while (lVar6 != 0x20);
        }
        else {
          lVar6 = 0;
          do {
            duckdb_fastpforlib::internal::fastunpack_quarter
                      (in,this->decompression_buffer + lVar6,(uint)bVar2);
            lVar6 = lVar6 + 8;
            in = in + uVar7;
          } while (lVar6 != 0x20);
          switchD_015de399::default(data,this->decompression_buffer + uVar9,__n);
        }
        uVar3 = this->current_frame_of_reference;
        if ((this->current_group).mode == DELTA_FOR) {
          if (uVar3 != '\0') {
            sVar5 = 0;
            do {
              data[sVar5] = data[sVar5] + uVar3;
              sVar5 = sVar5 + 1;
            } while (__n != sVar5);
          }
          DeltaDecode<signed_char>((char *)data,this->current_delta_offset,__n);
          this->current_delta_offset = data[__n - 1];
        }
        else if (uVar3 != '\0') {
          sVar5 = 0;
          do {
            data[sVar5] = data[sVar5] + uVar3;
            sVar5 = sVar5 + 1;
          } while (__n != sVar5);
        }
        iVar10 = this->current_group_offset + __n;
      }
      this->current_group_offset = iVar10;
      uVar8 = uVar8 + __n;
    } while (uVar8 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}